

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

void __thiscall AutoFile::ignore(AutoFile *this,size_t nSize)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  char *this_00;
  long *plVar7;
  FILE *__stream;
  long in_FS_OFFSET;
  optional<long> *in_stack_ffffffffffffef58;
  unsigned_long *in_stack_ffffffffffffef60;
  io_errc __e;
  error_code *in_stack_ffffffffffffef68;
  size_t nNow;
  AutoFile *this_local;
  size_t nSize_local;
  uchar data [4096];
  
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nSize_local = nSize;
  if (this->m_file == (FILE *)0x0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffef68,(io_errc)((ulong)in_stack_ffffffffffffef60 >> 0x20));
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"AutoFile::ignore: file handle is nullptr");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    while (nSize_local != 0) {
      puVar5 = std::min<unsigned_long>
                         (in_stack_ffffffffffffef60,(unsigned_long *)in_stack_ffffffffffffef58);
      puVar5 = (unsigned_long *)*puVar5;
      __stream = (FILE *)0x1;
      puVar6 = (unsigned_long *)fread(data,1,(size_t)puVar5,(FILE *)this->m_file);
      if (puVar6 != puVar5) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        __e = (io_errc)((ulong)in_stack_ffffffffffffef60 >> 0x20);
        uVar3 = feof(this,__stream);
        this_00 = "AutoFile::ignore: fread failed";
        if ((uVar3 & 1) != 0) {
          this_00 = "AutoFile::ignore: end of file";
        }
        std::error_code::error_code<std::io_errc,void>((error_code *)this_00,__e);
        std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)this_00);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_00892dda;
      }
      nSize_local = nSize_local - (long)puVar5;
      bVar2 = std::optional<long>::has_value(in_stack_ffffffffffffef58);
      if (bVar2) {
        plVar7 = std::optional<long>::operator*(in_stack_ffffffffffffef58);
        *plVar7 = (long)puVar5 + *plVar7;
        in_stack_ffffffffffffef60 = puVar5;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
LAB_00892dda:
  __stack_chk_fail();
}

Assistant:

void AutoFile::ignore(size_t nSize)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::ignore: file handle is nullptr");
    unsigned char data[4096];
    while (nSize > 0) {
        size_t nNow = std::min<size_t>(nSize, sizeof(data));
        if (std::fread(data, 1, nNow, m_file) != nNow) {
            throw std::ios_base::failure(feof() ? "AutoFile::ignore: end of file" : "AutoFile::ignore: fread failed");
        }
        nSize -= nNow;
        if (m_position.has_value()) *m_position += nNow;
    }
}